

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_client.hpp
# Opt level: O0

Lazy<void> __thiscall
cinatra::coro_http_client::send_fstream_with_chunked<std::shared_ptr<std::__cxx11::stringstream>>
          (coro_http_client *this,
          shared_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *source,error_code *ec)

{
  string_view chunk_data;
  bool bVar1;
  byte bVar2;
  undefined8 *puVar3;
  LazyPromise<void> *this_00;
  element_type *peVar4;
  char *pcVar5;
  size_type sVar6;
  undefined8 *extraout_RAX;
  __enable_if_t<__assignable<std::error_code,_unsigned_long>(),_tuple<error_code_&,_unsigned_long_&>_&>
  ptVar7;
  undefined8 *extraout_RAX_00;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  LazyBase<void,_false> in_RDI;
  undefined4 in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd54;
  undefined4 in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd5c;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  LazyPromise<void> *in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  int local_284;
  int local_270;
  size_type *psVar8;
  string *size_str;
  vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *buffers;
  basic_string_view<char,_std::char_traits<char>_> *this_01;
  char *pcVar9;
  
  puVar3 = (undefined8 *)operator_new(0x118,(nothrow_t *)&std::nothrow);
  if (puVar3 == (undefined8 *)0x0) {
    async_simple::coro::detail::LazyPromise<void>::get_return_object_on_allocation_failure();
  }
  else {
    *puVar3 = send_fstream_with_chunked<std::shared_ptr<std::__cxx11::stringstream>>;
    puVar3[1] = send_fstream_with_chunked<std::shared_ptr<std::__cxx11::stringstream>>;
    psVar8 = puVar3 + 0x1d;
    size_str = (string *)(puVar3 + 0xe);
    buffers = (vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *)(puVar3 + 10);
    this_01 = (basic_string_view<char,_std::char_traits<char>_> *)(puVar3 + 0x14);
    pcVar9 = (char *)(puVar3 + 0x11);
    this_00 = (LazyPromise<void> *)(puVar3 + 2);
    puVar3[0x21] = in_RSI;
    puVar3[0x19] = in_RDX;
    puVar3[0x1a] = in_RCX;
    async_simple::coro::detail::LazyPromise<void>::LazyPromise
              ((LazyPromise<void> *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
    async_simple::coro::detail::LazyPromise<void>::get_return_object(in_stack_fffffffffffffd68);
    async_simple::coro::detail::LazyPromiseBase::initial_suspend((LazyPromiseBase *)this_00);
    bVar1 = std::suspend_always::await_ready((suspend_always *)((long)puVar3 + 0x115));
    if (bVar1) {
      std::suspend_always::await_resume((suspend_always *)((long)puVar3 + 0x115));
      puVar3[0x1b] = 0;
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
      detail::resize<char>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                 CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
      do {
        std::
        __shared_ptr_access<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x33a4da);
        bVar2 = std::ios::eof();
        if (((bVar2 ^ 0xff) & 1) == 0) goto LAB_0033a8ee;
        peVar4 = std::
                 __shared_ptr_access<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x33a517);
        pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 data((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x33a529)
        ;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(puVar3 + 6)
                  );
        std::istream::read((char *)peVar4,(long)pcVar5);
        sVar6 = std::istream::gcount();
        *psVar8 = sVar6;
        std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>::vector
                  ((vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *)0x33a58e);
        std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
        pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 data((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x33a5a8)
        ;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (this_01,pcVar5,*psVar8);
        std::
        __shared_ptr_access<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x33a5d3);
        std::ios::eof();
        chunk_data._M_str = pcVar9;
        chunk_data._M_len = (size_t)this_01;
        to_chunked_buffers(buffers,size_str,chunk_data,SUB81((ulong)psVar8 >> 0x38,0));
        async_write<std::vector<asio::const_buffer,std::allocator<asio::const_buffer>>&>
                  ((coro_http_client *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58)
                   ,(vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *)
                    CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
        async_simple::coro::detail::LazyPromiseBase::
        await_transform<async_simple::coro::Lazy<std::pair<std::error_code,unsigned_long>>>
                  ((LazyPromiseBase *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                   (Lazy<std::pair<std::error_code,_unsigned_long>_> *)
                   CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
        bVar1 = async_simple::coro::detail::
                LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_>::await_ready
                          ((LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                           (puVar3 + 0x1e));
        if (!bVar1) {
          *(undefined1 *)((long)puVar3 + 0x114) = 1;
          send_fstream_with_chunked
                    ((void *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                     in_stack_fffffffffffffd68);
          (*(code *)*extraout_RAX)(extraout_RAX);
          return (Lazy<void>)in_RDI._coro.__handle_.__handle_;
        }
        puVar3[0x18] = (LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                       (puVar3 + 0x1e);
        async_simple::coro::detail::LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_>::
        awaitResume((LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                    CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
        std::tie<std::error_code,unsigned_long>
                  ((error_code *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                   (unsigned_long *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
        ptVar7 = std::tuple<std::error_code&,unsigned_long&>::operator=
                           ((tuple<std::error_code_&,_unsigned_long_&> *)
                            CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                            (pair<std::error_code,_unsigned_long> *)
                            CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
        puVar3[0x20] = ptVar7;
        async_simple::coro::detail::LazyBase<std::pair<std::error_code,_unsigned_long>,_false>::
        ValueAwaiter::~ValueAwaiter((ValueAwaiter *)0x33a818);
        async_simple::coro::Lazy<std::pair<std::error_code,_unsigned_long>_>::~Lazy
                  ((Lazy<std::pair<std::error_code,_unsigned_long>_> *)0x33a825);
        bVar1 = std::error_code::operator_cast_to_bool((error_code *)puVar3[0x1a]);
        if (bVar1) {
          local_270 = 5;
        }
        else {
          local_270 = 0;
        }
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
        std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>::~vector
                  ((vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *)
                   CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
      } while (local_270 == 0);
      if (local_270 == 5) {
LAB_0033a8ee:
        local_284 = 0;
      }
      else {
        local_284 = local_270;
      }
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
      if (local_284 == 0) {
        async_simple::coro::detail::LazyPromise<void>::return_void(this_00);
        async_simple::coro::detail::LazyPromiseBase::final_suspend((LazyPromiseBase *)this_00);
        bVar1 = async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_ready
                          ((FinalAwaiter *)((long)puVar3 + 0x116));
        if (!bVar1) {
          *puVar3 = 0;
          *(undefined1 *)((long)puVar3 + 0x114) = 2;
          send_fstream_with_chunked
                    ((void *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                     (void *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
          (*(code *)*extraout_RAX_00)(extraout_RAX_00);
          return (Lazy<void>)in_RDI._coro.__handle_.__handle_;
        }
        async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_resume
                  ((FinalAwaiter *)((long)puVar3 + 0x116));
      }
      async_simple::coro::detail::LazyPromise<void>::~LazyPromise((LazyPromise<void> *)0x33aa9f);
      if (puVar3 != (undefined8 *)0x0) {
        operator_delete(puVar3,0x118);
      }
    }
    else {
      *(undefined1 *)((long)puVar3 + 0x114) = 0;
      send_fstream_with_chunked
                ((void *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                 (void *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
    }
  }
  return (Lazy<void>)in_RDI._coro.__handle_;
}

Assistant:

async_simple::coro::Lazy<void> send_fstream_with_chunked(
      Source &source, std::error_code &ec) {
    size_t size = 0;
    std::string file_data;
    detail::resize(file_data, max_single_part_size_);
    while (!source->eof()) {
      size_t rd_size =
          source->read(file_data.data(), file_data.size()).gcount();
      std::vector<asio::const_buffer> bufs;
      std::string size_str;
      cinatra::to_chunked_buffers(bufs, size_str, {file_data.data(), rd_size},
                                  source->eof());
      if (std::tie(ec, size) = co_await async_write(bufs); ec) {
        break;
      }
    }
  }